

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O2

void __thiscall Fl_Tabs::Fl_Tabs(Fl_Tabs *this,int X,int Y,int W,int H,char *l)

{
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,l);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Tabs_002795e8;
  (this->super_Fl_Group).super_Fl_Widget.box_ = '\x06';
  this->value_ = (Fl_Widget *)0x0;
  this->push_ = (Fl_Widget *)0x0;
  this->tab_pos = (int *)0x0;
  this->tab_width = (int *)0x0;
  this->tab_count = 0;
  return;
}

Assistant:

Fl_Tabs::Fl_Tabs(int X,int Y,int W, int H, const char *l) :
  Fl_Group(X,Y,W,H,l)
{
  box(FL_THIN_UP_BOX);
#if FLTK_ABI_VERSION >= 10304
  // NEW (nothing)
#else
  // OLD (init to prevent 'unused' warnings) -- STR #3169
  value_ = 0;	// NOTE: this member unused -- STR #3169
#endif
  push_ = 0;
  tab_pos = 0;
  tab_width = 0;
  tab_count = 0;
}